

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_service_client(t_lua_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  t_service *ptVar2;
  t_function *tfunction;
  t_struct *ptVar3;
  string prefix;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  t_type *type;
  char *pcVar7;
  pointer pptVar8;
  string sig;
  string argname;
  string funcname;
  string classname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  pointer pptVar9;
  t_lua_generator *ptVar10;
  t_struct *in_stack_fffffffffffffdf0;
  string local_208;
  string local_1e8;
  allocator local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_188;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  pcVar7 = "Client";
  std::operator+(&local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar4),"Client");
  ptVar2 = tservice->extends_;
  poVar5 = std::operator<<(out,(string *)&local_1a8);
  std::operator<<(poVar5," = __TObject.new(");
  if (ptVar2 == (t_service *)0x0) {
    pcVar7 = "__TClient";
    poVar5 = out;
  }
  else {
    iVar4 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    poVar5 = out;
    out = std::operator<<(out,(string *)CONCAT44(extraout_var_00,iVar4));
  }
  std::operator<<(out,pcVar7);
  poVar6 = std::operator<<(poVar5,", {");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"  __type = \'");
  poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
  poVar6 = std::operator<<(poVar6,"\'");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"})");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_188,&tservice->functions_
            );
  ptVar10 = this;
  while (local_188._M_impl.super__Vector_impl_data._M_start !=
         local_188._M_impl.super__Vector_impl_data._M_finish) {
    tfunction = *local_188._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string(local_50,"",local_1c8);
    prefix._M_string_length = (size_type)local_188._M_impl.super__Vector_impl_data._M_start;
    prefix._M_dataplus._M_p = (pointer)poVar5;
    prefix.field_2._M_allocated_capacity = (size_type)ptVar10;
    prefix.field_2._8_8_ = in_stack_fffffffffffffdf0;
    function_signature(&local_208,this,tfunction,prefix);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::string
              ((string *)local_1c8,
               (string *)&(*local_188._M_impl.super__Vector_impl_data._M_start)->name_);
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"function ");
    poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = std::operator<<(poVar6,(string *)&local_208);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"self:send_");
    poVar6 = std::operator<<(poVar6,(string *)&local_208);
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    std::operator<<(poVar6,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    pptVar9 = local_188._M_impl.super__Vector_impl_data._M_start;
    if ((*local_188._M_impl.super__Vector_impl_data._M_start)->oneway_ == false) {
      iVar4 = (*((*local_188._M_impl.super__Vector_impl_data._M_start)->returntype_->super_t_doc).
                _vptr_t_doc[4])();
      pptVar9 = local_188._M_impl.super__Vector_impl_data._M_start;
      if ((char)iVar4 == '\0') {
        std::operator<<(poVar5,"return ");
        pptVar9 = local_188._M_impl.super__Vector_impl_data._M_start;
      }
      poVar6 = std::operator<<(poVar5,"self:recv_");
      poVar6 = std::operator<<(poVar6,(string *)&local_208);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"end");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"function ");
    poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
    poVar6 = std::operator<<(poVar6,":send_");
    poVar6 = std::operator<<(poVar6,(string *)&local_208);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"self.oprot:writeMessageBegin(\'");
    poVar6 = std::operator<<(poVar6,(string *)local_1c8);
    poVar6 = std::operator<<(poVar6,"\', ");
    pcVar7 = "TMessageType.CALL";
    if ((*pptVar9)->oneway_ != false) {
      pcVar7 = "TMessageType.ONEWAY";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,", self._seqid)");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"local args = ");
    poVar6 = std::operator<<(poVar6,(string *)local_1c8);
    poVar6 = std::operator<<(poVar6,"_args:new{}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    in_stack_fffffffffffffdf0 = (*pptVar9)->arglist_;
    for (pptVar8 = (in_stack_fffffffffffffdf0->members_).
                   super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pptVar8 !=
        (in_stack_fffffffffffffdf0->members_).
        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data.
        _M_finish; pptVar8 = pptVar8 + 1) {
      std::__cxx11::string::string((string *)&local_1e8,(string *)&(*pptVar8)->name_);
      if ((*pptVar8)->value_ == (t_const_value *)0x0) {
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"args.");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6," = ");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      else {
        type = t_type::get_true_type((*pptVar8)->type_);
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"if ");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6," ~= nil then");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"args.");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6," = ");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"else");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"args.");
        poVar6 = std::operator<<(poVar6,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6," = ");
        render_const_value_abi_cxx11_(&local_170,this,type,(*pptVar8)->value_);
        poVar6 = std::operator<<(poVar6,(string *)&local_170);
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        this = ptVar10;
        std::__cxx11::string::~string((string *)&local_170);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        ptVar10 = this;
        poVar6 = t_generator::indent((t_generator *)this,poVar5);
        poVar6 = std::operator<<(poVar6,"end");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"args:write(self.oprot)");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"self.oprot:writeMessageEnd()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"self.oprot.trans:flush()");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar6 = t_generator::indent((t_generator *)this,poVar5);
    poVar6 = std::operator<<(poVar6,"end");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    if ((*pptVar9)->oneway_ == false) {
      poVar6 = t_generator::indent((t_generator *)this,poVar5);
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"function ");
      poVar6 = std::operator<<(poVar6,(string *)&local_1a8);
      poVar6 = std::operator<<(poVar6,":recv_");
      poVar6 = std::operator<<(poVar6,(string *)&local_208);
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
      poVar6 = std::operator<<(poVar5,(string *)&local_1e8);
      poVar6 = std::operator<<(poVar6,"local fname, mtype, rseqid = self.iprot:");
      poVar6 = std::operator<<(poVar6,"readMessageBegin()");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_170);
      poVar6 = std::operator<<(poVar6,"if mtype == TMessageType.EXCEPTION then");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_70);
      poVar6 = std::operator<<(poVar6,"  local x = TApplicationException:new{}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_90);
      poVar6 = std::operator<<(poVar6,"  x:read(self.iprot)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_b0);
      poVar6 = std::operator<<(poVar6,"  self.iprot:readMessageEnd()");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_d0);
      poVar6 = std::operator<<(poVar6,"  error(x)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_f0);
      poVar6 = std::operator<<(poVar6,"end");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_110);
      poVar6 = std::operator<<(poVar6,"local result = ");
      poVar6 = std::operator<<(poVar6,(string *)local_1c8);
      poVar6 = std::operator<<(poVar6,"_result:new{}");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_130);
      poVar6 = std::operator<<(poVar6,"result:read(self.iprot)");
      poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
      poVar6 = std::operator<<(poVar6,(string *)&local_150);
      poVar6 = std::operator<<(poVar6,"self.iprot:readMessageEnd()");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1e8);
      iVar4 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar4 == '\0') {
        t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
        poVar6 = std::operator<<(poVar5,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6,"if result.success ~= nil then");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_170);
        poVar6 = std::operator<<(poVar6,"  return result.success");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1e8);
        ptVar3 = (*pptVar9)->xceptions_;
        this = ptVar10;
        for (pptVar8 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            pptVar8 !=
            (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
          t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
          poVar6 = std::operator<<(poVar5,(string *)&local_1e8);
          poVar6 = std::operator<<(poVar6,"elseif result.");
          poVar6 = std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
          poVar6 = std::operator<<(poVar6," then");
          poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
          poVar6 = std::operator<<(poVar6,(string *)&local_170);
          poVar6 = std::operator<<(poVar6,"  error(result.");
          poVar6 = std::operator<<(poVar6,(string *)&(*pptVar8)->name_);
          poVar6 = std::operator<<(poVar6,")");
          std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        ptVar10 = this;
        t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
        poVar6 = std::operator<<(poVar5,(string *)&local_1e8);
        poVar6 = std::operator<<(poVar6,"end");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_170,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_170);
        poVar6 = std::operator<<(poVar6,"error(TApplicationException:new{errorCode = ");
        poVar6 = std::operator<<(poVar6,"TApplicationException.MISSING_RESULT})");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,poVar5);
      poVar6 = std::operator<<(poVar6,"end");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    local_188._M_impl.super__Vector_impl_data._M_start = pptVar9 + 1;
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void t_lua_generator::generate_service_client(ostream& out, t_service* tservice) {
  string classname = tservice->get_name() + "Client";
  t_service* extends_s = tservice->get_extends();

  // Client object definition
  out << classname << " = __TObject.new(";
  if (extends_s != nullptr) {
    out << extends_s->get_name() << "Client";
  } else {
    out << "__TClient";
  }
  out << ", {" << endl << "  __type = '" << classname << "'" << endl << "})" << endl;

  // Send/Recv functions
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string sig = function_signature(*f_iter);
    string funcname = (*f_iter)->get_name();

    // Wrapper function
    indent(out) << endl << "function " << classname << ":" << sig << endl;
    indent_up();

    indent(out) << "self:send_" << sig << endl << indent();
    if (!(*f_iter)->is_oneway()) {
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << "return ";
      }
      out << "self:recv_" << sig << endl;
    }

    indent_down();
    indent(out) << "end" << endl;

    // Send function
    indent(out) << endl << "function " << classname << ":send_" << sig << endl;
    indent_up();

    indent(out) << "self.oprot:writeMessageBegin('" << funcname << "', "
                << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
                << ", self._seqid)" << endl;
    indent(out) << "local args = " << funcname << "_args:new{}" << endl;

    // Set the args
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    for (fld_iter = args.begin(); fld_iter != args.end(); ++fld_iter) {
      std::string argname = (*fld_iter)->get_name();
      if ((*fld_iter)->get_value() != nullptr) {
        // Insert default value for nil arguments
        t_type* type = get_true_type((*fld_iter)->get_type());
        indent(out) << "if " << argname << " ~= nil then" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << argname << endl;
        indent_down();
        indent(out) << "else" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << render_const_value(type, (*fld_iter)->get_value()) << endl;
        indent_down();
        indent(out) << "end" << endl;
      } else {
        indent(out) << "args." << argname << " = " << argname << endl;
      }
    }

    indent(out) << "args:write(self.oprot)" << endl;
    indent(out) << "self.oprot:writeMessageEnd()" << endl;
    indent(out) << "self.oprot.trans:flush()" << endl;

    indent_down();
    indent(out) << "end" << endl;

    // Recv function
    if (!(*f_iter)->is_oneway()) {
      indent(out) << endl << "function " << classname << ":recv_" << sig << endl;
      indent_up();

      out << indent() << "local fname, mtype, rseqid = self.iprot:"
          << "readMessageBegin()" << endl << indent() << "if mtype == TMessageType.EXCEPTION then"
          << endl << indent() << "  local x = TApplicationException:new{}" << endl << indent()
          << "  x:read(self.iprot)" << endl << indent() << "  self.iprot:readMessageEnd()" << endl
          << indent() << "  error(x)" << endl << indent() << "end" << endl << indent()
          << "local result = " << funcname << "_result:new{}" << endl << indent()
          << "result:read(self.iprot)" << endl << indent() << "self.iprot:readMessageEnd()" << endl;

      // Return the result if it's not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << indent() << "if result.success ~= nil then" << endl << indent() << "  return result.success"
            << endl;

        // Throw custom exceptions
        const std::vector<t_field*>& xf = (*f_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator x_iter;
        for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
          out << indent() << "elseif result." << (*x_iter)->get_name() << " then" << endl
              << indent() << "  error(result." << (*x_iter)->get_name() << ")" << endl;
        }

        out << indent() << "end" << endl << indent()
            << "error(TApplicationException:new{errorCode = "
            << "TApplicationException.MISSING_RESULT})" << endl;
      }

      indent_down();
      indent(out) << "end" << endl;
    }
  }
}